

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool blobcmp(curl_blob *first,curl_blob *second)

{
  int iVar1;
  curl_blob *second_local;
  curl_blob *first_local;
  
  if ((first == (curl_blob *)0x0) && (second == (curl_blob *)0x0)) {
    first_local._7_1_ = true;
  }
  else if ((first == (curl_blob *)0x0) || (second == (curl_blob *)0x0)) {
    first_local._7_1_ = false;
  }
  else if (first->len == second->len) {
    iVar1 = memcmp(first->data,second->data,first->len);
    first_local._7_1_ = iVar1 == 0;
  }
  else {
    first_local._7_1_ = false;
  }
  return first_local._7_1_;
}

Assistant:

static bool blobcmp(struct curl_blob *first, struct curl_blob *second)
{
  if(!first && !second) /* both are NULL */
    return TRUE;
  if(!first || !second) /* one is NULL */
    return FALSE;
  if(first->len != second->len) /* different sizes */
    return FALSE;
  return !memcmp(first->data, second->data, first->len); /* same data */
}